

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_htmlIsBooleanAttr(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 local_38;
  xmlChar *name;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("htmlIsBooleanAttr");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT(py_retval,"z:htmlIsBooleanAttr",&local_38);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      name._4_4_ = htmlIsBooleanAttr(local_38);
      self_local = libxml_intWrap(name._4_4_);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_htmlIsBooleanAttr(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlChar * name;

    if (libxml_deprecationWarning("htmlIsBooleanAttr") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"z:htmlIsBooleanAttr", &name))
        return(NULL);

    c_retval = htmlIsBooleanAttr(name);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}